

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_NtkMatchPrintPerm(word Perm,int nInps)

{
  int iVar1;
  int local_18;
  int i;
  int nInps_local;
  word Perm_local;
  
  _i = Perm;
  if (nInps < 0x11) {
    for (local_18 = 0; local_18 < nInps; local_18 = local_18 + 1) {
      iVar1 = Abc_TtGetHex((word *)&i,local_18);
      printf("%c",(ulong)(iVar1 + 0x61));
    }
    printf("\n");
    return;
  }
  __assert_fail("nInps <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                ,0x52b,"void Ifn_NtkMatchPrintPerm(word, int)");
}

Assistant:

void Ifn_NtkMatchPrintPerm( word Perm, int nInps )
{
    int i;
    assert( nInps <= 16 );
    for ( i = 0; i < nInps; i++ )
        printf( "%c", 'a' + Abc_TtGetHex(&Perm, i) );
    printf( "\n" );
}